

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

void __thiscall
vkt::memory::anon_unknown_0::BufferCopyFromBuffer::~BufferCopyFromBuffer(BufferCopyFromBuffer *this)

{
  ~BufferCopyFromBuffer(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

~BufferCopyFromBuffer	(void) {}